

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_strutils.cpp
# Opt level: O0

bool crnlib::int_to_string(int value,char *pDst,uint len)

{
  char *pcVar1;
  uint local_5c;
  char *local_58;
  size_t i;
  size_t total_bytes;
  char *p;
  uint j;
  char buf [16];
  uint cBufSize;
  uint len_local;
  char *pDst_local;
  int value_local;
  
  local_5c = value;
  if (value < 0) {
    local_5c = -value;
  }
  p._4_4_ = local_5c;
  buf[7] = '\0';
  pcVar1 = buf + 6;
  do {
    total_bytes = (size_t)pcVar1;
    pcVar1 = (char *)(total_bytes - 1);
    *(char *)total_bytes = (char)((ulong)p._4_4_ % 10) + '0';
    p._4_4_ = p._4_4_ / 10;
  } while (p._4_4_ != 0);
  if (value < 0) {
    *pcVar1 = 0x2d;
    pcVar1 = (char *)(total_bytes - 2);
  }
  total_bytes = (size_t)pcVar1;
  if ((char *)(ulong)len < buf + (7 - total_bytes)) {
    pDst_local._7_1_ = false;
  }
  else {
    for (local_58 = (char *)0x0; local_58 < buf + (7 - total_bytes); local_58 = local_58 + 1) {
      pDst[(long)local_58] = local_58[total_bytes + 1];
    }
    pDst_local._7_1_ = true;
  }
  return pDst_local._7_1_;
}

Assistant:

bool int_to_string(int value, char* pDst, uint len)
    {
        CRNLIB_ASSERT(pDst);

        const uint cBufSize = 16;
        char buf[cBufSize];

        uint j = static_cast<uint>((value < 0) ? -value : value);

        char* p = buf + cBufSize - 1;

        *p-- = '\0';

        do
        {
            *p-- = static_cast<uint8>('0' + (j % 10));
            j /= 10;
        } while (j);

        if (value < 0)
        {
            *p-- = '-';
        }

        const size_t total_bytes = (buf + cBufSize - 1) - p;
        if (total_bytes > len)
        {
            return false;
        }

        for (size_t i = 0; i < total_bytes; i++)
        {
            pDst[i] = p[1 + i];
        }

        return true;
    }